

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O1

void __thiscall soul::RenderingVenue::Pimpl::addActiveSession(Pimpl *this,SessionImpl *session)

{
  int iVar1;
  SessionImpl *local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->sessionListLock);
  if (iVar1 == 0) {
    local_20 = session;
    std::
    vector<soul::RenderingVenue::Pimpl::SessionImpl*,std::allocator<soul::RenderingVenue::Pimpl::SessionImpl*>>
    ::emplace_back<soul::RenderingVenue::Pimpl::SessionImpl*>
              ((vector<soul::RenderingVenue::Pimpl::SessionImpl*,std::allocator<soul::RenderingVenue::Pimpl::SessionImpl*>>
                *)&this->activeSessions,&local_20);
    pthread_mutex_unlock((pthread_mutex_t *)&this->sessionListLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void addActiveSession (SessionImpl& session)
    {
        std::lock_guard<std::mutex> l (sessionListLock);
        activeSessions.push_back (std::addressof (session));
    }